

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O1

void __thiscall PatternModel::selectRow(PatternModel *this,int row)

{
  int iVar1;
  ulong uVar2;
  PatternAnchor start;
  PatternAnchor end;
  
  if (-1 < row) {
    iVar1 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
    if (row < iVar1) {
      if (this->mHasSelection == false) {
        this->mHasSelection = true;
        start.super_PatternCursorBase.track = 0;
        start.super_PatternCursorBase.row = row;
        start.super_PatternCursorBase.column = 0;
        PatternSelection::setStart(&this->mSelection,start);
      }
      uVar2 = CONCAT44(0,row) | 0x400000000;
      end.super_PatternCursorBase.track = 3;
      end.super_PatternCursorBase.row = (int)uVar2;
      end.super_PatternCursorBase.column = (int)(uVar2 >> 0x20);
      PatternSelection::setEnd(&this->mSelection,end);
      selectionChanged(this);
      return;
    }
  }
  return;
}

Assistant:

void PatternModel::selectRow(int row) {
    if (row >= 0 && row < (int)mPatternCurr.totalRows()) {
        if (!mHasSelection) {
            mHasSelection = true;
            mSelection.setStart({row, 0, 0});
        }
        mSelection.setEnd({row, PatternAnchor::MAX_SELECTS - 1, PatternAnchor::MAX_TRACKS - 1});
        emit selectionChanged();
    }
}